

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,LoopDim *args)

{
  ulong uVar1;
  _Storage<slang::ConstantRange,_true> *p_Var2;
  undefined8 uVar3;
  _Storage<slang::ConstantRange,_true> _Var4;
  size_type sVar5;
  pointer pLVar6;
  pointer pLVar7;
  size_type sVar8;
  pointer pLVar9;
  long lVar10;
  ulong capacity;
  pointer pLVar11;
  
  pLVar11 = this->data_ + this->len;
  if (this->len == this->cap) {
    if (this->len == 0x7fffffffffffffff) {
      detail::throwLengthError();
    }
    capacity = this->len + 1;
    uVar1 = this->cap;
    if (capacity < uVar1 * 2) {
      capacity = uVar1 * 2;
    }
    if (0x7fffffffffffffff - uVar1 < uVar1) {
      capacity = 0x7fffffffffffffff;
    }
    lVar10 = (long)pLVar11 - (long)this->data_;
    pLVar6 = (pointer)detail::allocArray(capacity,0x18);
    *(IteratorSymbol **)((long)pLVar6 + lVar10 + 0x10) = args->loopVar;
    _Var4 = *(_Storage<slang::ConstantRange,_true> *)
             &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_engaged;
    *(_Storage<slang::ConstantRange,_true> *)((long)pLVar6 + lVar10) =
         (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ConstantRange>._M_payload;
    ((_Storage<slang::ConstantRange,_true> *)((long)pLVar6 + lVar10))[1] = _Var4;
    pLVar7 = this->data_;
    sVar8 = this->len;
    if (pLVar7 + sVar8 == pLVar11) {
      pLVar9 = pLVar6;
      if (sVar8 != 0) {
        do {
          pLVar9->loopVar = pLVar7->loopVar;
          uVar3 = *(undefined8 *)
                   &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_engaged;
          (pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_payload =
               (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload;
          *(undefined8 *)
           &(pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
          pLVar7 = pLVar7 + 1;
          pLVar9 = pLVar9 + 1;
        } while (pLVar7 != pLVar11);
      }
    }
    else {
      pLVar9 = pLVar6;
      if (pLVar7 != pLVar11) {
        do {
          pLVar9->loopVar = pLVar7->loopVar;
          uVar3 = *(undefined8 *)
                   &(pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_engaged;
          (pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_payload =
               (pLVar7->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange>._M_payload;
          *(undefined8 *)
           &(pLVar9->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
          pLVar7 = pLVar7 + 1;
          pLVar9 = pLVar9 + 1;
        } while (pLVar7 != pLVar11);
        pLVar7 = this->data_;
        sVar8 = this->len;
      }
      if (pLVar7 + sVar8 != pLVar11) {
        p_Var2 = (_Storage<slang::ConstantRange,_true> *)((long)pLVar6 + lVar10);
        do {
          p_Var2[5] = (_Storage<slang::ConstantRange,_true>)pLVar11->loopVar;
          _Var4 = *(_Storage<slang::ConstantRange,_true> *)
                   &(pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                    _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_engaged;
          p_Var2[3] = (pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>.
                      _M_payload.super__Optional_payload_base<slang::ConstantRange>._M_payload;
          p_Var2[4] = _Var4;
          pLVar11 = pLVar11 + 1;
          p_Var2 = p_Var2 + 3;
        } while (pLVar11 != pLVar7 + sVar8);
      }
    }
    if (this->data_ != (pointer)this->firstElement) {
      free(this->data_);
    }
    this->len = this->len + 1;
    this->cap = capacity;
    this->data_ = pLVar6;
    return (reference)((long)pLVar6 + lVar10);
  }
  pLVar11->loopVar = args->loopVar;
  uVar3 = *(undefined8 *)
           &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
  (pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload =
       (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ConstantRange>._M_payload;
  *(undefined8 *)
   &(pLVar11->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
  sVar8 = this->len;
  sVar5 = sVar8 + 1;
  this->len = sVar5;
  if (sVar5 == 0) {
    assert::assertFailed
              ("len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x62,
               "reference slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::back() [T = slang::ast::ForeachLoopStatement::LoopDim]"
              );
  }
  return this->data_ + sVar8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }